

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::MatchesRegexMatcher::MatchAndExplain<std::__cxx11::string>
          (MatchesRegexMatcher *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  pointer pcVar1;
  RE *re;
  bool bVar2;
  string s2;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,pcVar1,pcVar1 + s->_M_string_length);
  re = (this->regex_).super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  if (this->full_match_ == true) {
    bVar2 = RE::FullMatch((char *)local_38[0],re);
  }
  else {
    bVar2 = RE::PartialMatch((char *)local_38[0],re);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const std::string s2(s);
    return full_match_ ? RE::FullMatch(s2, *regex_)
                       : RE::PartialMatch(s2, *regex_);
  }